

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall
GlobOpt::InsertCloneStrs
          (GlobOpt *this,BasicBlock *toBlock,GlobOptBlockData *toData,GlobOptBlockData *fromData)

{
  Type TVar1;
  Loop *pLVar2;
  BasicBlock *this_00;
  SymTable *this_01;
  ValueInfo *pVVar3;
  Instr *this_02;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  undefined4 *puVar8;
  BVSparse<Memory::JitArenaAllocator> *pBVar9;
  StackSym *sym;
  Value *pVVar10;
  Value *pVVar11;
  Instr *this_03;
  RegOpnd *newDst;
  SymID id;
  BVUnitT<unsigned_long> local_48;
  SparseBVUnit _unit;
  
  if ((((toBlock->field_0x18 & 4) != 0) &&
      (toBlock->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0)) &&
     (this->prePassLoop == (Loop *)0x0)) {
    pLVar2 = toBlock->loop;
    this_00 = pLVar2->landingPad;
    this_01 = this->func->m_symTable;
    _unit.word = (Type)fromData;
    bVar6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this->tempBv);
    if (bVar6) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1574,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar6) {
LAB_00401e31:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::And
              (this->tempBv,toBlock->cloneStrCandidates,
               *(BVSparse<Memory::JitArenaAllocator> **)(_unit.word + 0x28));
    pBVar9 = this->tempBv;
    while (pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)pBVar9->head,
          pBVar9 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      TVar1 = *(Type *)&pBVar9->lastFoundIndex;
      local_48.word = ((Type *)&pBVar9->alloc)->word;
      while (local_48.word != 0) {
        lVar4 = 0;
        if (local_48.word != 0) {
          for (; (local_48.word >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        id = (BVIndex)lVar4 + TVar1;
        BVUnitT<unsigned_long>::Clear(&local_48,(BVIndex)lVar4);
        sym = (StackSym *)SymTable::Find(this_01,id);
        if (sym == (StackSym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x1579,"(sym)","sym");
          if (!bVar6) goto LAB_00401e31;
          *puVar8 = 0;
        }
        BVar7 = BVSparse<Memory::JitArenaAllocator>::Test((this_00->globOptData).liveVarSyms,id);
        if (((BVar7 != '\0') &&
            (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                               (*(BVSparse<Memory::JitArenaAllocator> **)(_unit.word + 0x30),id),
            BVar7 != '\0')) &&
           ((pVVar10 = GlobOptBlockData::FindValue(&this_00->globOptData,(Sym *)sym),
            pVVar10 != (Value *)0x0 &&
            (pVVar11 = GlobOptBlockData::FindValue((GlobOptBlockData *)_unit.word,(Sym *)sym),
            pVVar11 != (Value *)0x0)))) {
          pVVar3 = pVVar11->valueInfo;
          bVar6 = ValueType::IsLikelyString(&pVVar10->valueInfo->super_ValueType);
          if ((bVar6) && (bVar6 = ValueType::IsLikelyString(&pVVar3->super_ValueType), bVar6)) {
            this_03 = IR::Instr::New(CloneStr,this->func);
            newDst = IR::RegOpnd::New(sym,TyVar,this->func);
            IR::Instr::SetDst(this_03,&newDst->super_Opnd);
            IR::Instr::SetSrc1(this_03,&newDst->super_Opnd);
            this_02 = pLVar2->bailOutInfo->bailOutInstr;
            if (this_02 == (Instr *)0x0) {
              BasicBlock::InsertAfter(this_00,this_03);
            }
            else {
              IR::Instr::InsertBefore(this_02,this_03);
            }
            BVSparse<Memory::JitArenaAllocator>::Set(toData->isTempSrc,id);
          }
        }
      }
    }
    BVSparse<Memory::JitArenaAllocator>::ClearAll(this->tempBv);
  }
  return;
}

Assistant:

void GlobOpt::InsertCloneStrs(BasicBlock *toBlock, GlobOptBlockData *toData, GlobOptBlockData *fromData)
{
    if (toBlock->isLoopHeader   // isLoopBackEdge
        && toBlock->cloneStrCandidates
        && !IsLoopPrePass())
    {
        Loop *loop = toBlock->loop;
        BasicBlock *landingPad = loop->landingPad;
        const SymTable *const symTable = func->m_symTable;
        Assert(tempBv->IsEmpty());
        tempBv->And(toBlock->cloneStrCandidates, fromData->isTempSrc);
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const sym = (StackSym *)symTable->Find(id);
            Assert(sym);

            if (!landingPad->globOptData.liveVarSyms->Test(id)
                || !fromData->liveVarSyms->Test(id))
            {
                continue;
            }

            Value * landingPadValue = landingPad->globOptData.FindValue(sym);
            if (landingPadValue == nullptr)
            {
                continue;
            }

            Value * loopValue = fromData->FindValue(sym);
            if (loopValue == nullptr)
            {
                continue;
            }

            ValueInfo *landingPadValueInfo = landingPadValue->GetValueInfo();
            ValueInfo *loopValueInfo = loopValue->GetValueInfo();

            if (landingPadValueInfo->IsLikelyString()
                && loopValueInfo->IsLikelyString())
            {
                IR::Instr *cloneStr = IR::Instr::New(Js::OpCode::CloneStr, this->func);
                IR::RegOpnd *opnd = IR::RegOpnd::New(sym, IRType::TyVar, this->func);
                cloneStr->SetDst(opnd);
                cloneStr->SetSrc1(opnd);
                if (loop->bailOutInfo->bailOutInstr)
                {
                    loop->bailOutInfo->bailOutInstr->InsertBefore(cloneStr);
                }
                else
                {
                    landingPad->InsertAfter(cloneStr);
                }
                toData->isTempSrc->Set(id);
            }
        }
        NEXT_BITSET_IN_SPARSEBV;
        tempBv->ClearAll();
    }
}